

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

int Curl_pp_getsock(Curl_easy *data,pingpong *pp,curl_socket_t *socks)

{
  int iVar1;
  
  *socks = data->conn->sock[0];
  iVar1 = 0x10000;
  if (pp->sendleft == 0) {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Curl_pp_getsock(struct Curl_easy *data,
                    struct pingpong *pp, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  socks[0] = conn->sock[FIRSTSOCKET];

  if(pp->sendleft) {
    /* write mode */
    return GETSOCK_WRITESOCK(0);
  }

  /* read mode */
  return GETSOCK_READSOCK(0);
}